

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool __thiscall CreditAccount::create_account(CreditAccount *this,int client_id,short client_class)

{
  (this->super_Account).account_type = 2;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nEnter The Account No. : ",0x19);
  std::istream::operator>>(&std::cin,&(this->super_Account).account_number);
  (this->super_Account).client_id = client_id;
  (this->super_Account).client_class = client_class;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"\nEnter The Initial amount : ",0x1c);
  std::istream::_M_extract<float>((float *)&std::cin);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,
             "\n\n\n\n\n\n\n\n\n\n\n\n\n\n\n                   \t\t\t\t\t      Account Created..\n\n     \t\t\t\t\t                     ==>>Press Enter<<=="
             ,0x72);
  return true;
}

Assistant:

bool CreditAccount::create_account(int client_id, short client_class)
{
    /*!
     * To create a new credit account for one of the clients we need to determine:
     * client_id: id of the owner
     * account_number: bank account number of the account (it should be unique value but for now we just enter any value for the assignment)
     * client_class: class of the owner (Regular, Golden, VIP)
     * deposit: amount of initial balance of the new account
     */
    account_type = 2;
    std::cout<<"\nEnter The Account No. : ";
    std::cin>>account_number;
    this->client_id = client_id;
    this->client_class = client_class;
    std::cout<<"\nEnter The Initial amount : ";
    std::cin>>deposit;
    std::cout<<"\n\n\n\n\n\n\n\n\n\n\n\n\n\n\n                   \t\t\t\t\t      Account Created..\n\n     \t\t\t\t\t                     ==>>Press Enter<<==";

    return true;
}